

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int flatcc_emitter(void *emit_context,flatcc_iovec_t *iov,int iov_count,flatbuffers_soffset_t offset
                  ,size_t len)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  ulong *puVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  flatcc_iovec_t *pfVar10;
  
  *(long *)((long)emit_context + 0x30) = *(long *)((long)emit_context + 0x30) + len;
  if (offset < 0) {
    puVar5 = (ulong *)((long)emit_context + 0x18);
    uVar8 = *(ulong *)((long)emit_context + 0x18);
    if (len <= uVar8) {
      pvVar7 = (void *)(*(long *)((long)emit_context + 0x10) - len);
      *(void **)((long)emit_context + 0x10) = pvVar7;
      goto LAB_001211b7;
    }
    if (iov_count == 0) {
      return 0;
    }
    pfVar10 = iov + iov_count;
    do {
      uVar8 = pfVar10[-1].iov_len;
      pfVar10 = pfVar10 + -1;
      if (uVar8 != 0) {
        pvVar7 = (void *)((long)pfVar10->iov_base + uVar8);
        do {
          uVar6 = *puVar5;
          while ((uVar9 = uVar8, uVar6 < uVar8 && (uVar9 = uVar6, uVar6 == 0))) {
            lVar1 = *emit_context;
            if ((lVar1 == 0) ||
               (pvVar3 = *(void **)(lVar1 + 0xb88), pvVar3 == *(void **)((long)emit_context + 8))) {
              pvVar3 = malloc(0xb98);
              if (pvVar3 == (void *)0x0) {
                return -1;
              }
              *(long *)((long)emit_context + 0x38) = *(long *)((long)emit_context + 0x38) + 0xb80;
              if (lVar1 != 0) {
                lVar2 = *(long *)((long)emit_context + 8);
                *(long *)((long)pvVar3 + 0xb88) = lVar2;
                *(long *)((long)pvVar3 + 0xb80) = lVar1;
                *(void **)(lVar1 + 0xb88) = pvVar3;
                *(void **)(lVar2 + 0xb80) = pvVar3;
                goto LAB_001210e8;
              }
              *(void **)emit_context = pvVar3;
              *(void **)((long)emit_context + 8) = pvVar3;
              *(void **)((long)pvVar3 + 0xb80) = pvVar3;
              *(void **)((long)pvVar3 + 0xb88) = pvVar3;
              uVar6 = 0x5c0;
              *(long *)((long)emit_context + 0x10) = (long)pvVar3 + 0x5c0;
              *(long *)((long)emit_context + 0x20) = (long)pvVar3 + 0x5c0;
              *(undefined8 *)((long)emit_context + 0x18) = 0x5c0;
              *(undefined8 *)((long)emit_context + 0x28) = 0x5c0;
              iVar4 = -0x5c0;
            }
            else {
              *(int *)((long)pvVar3 + 0xb90) = *(int *)(lVar1 + 0xb90) + -0xb80;
LAB_001210e8:
              *(void **)emit_context = pvVar3;
              uVar6 = 0xb80;
              *(long *)((long)emit_context + 0x10) = (long)pvVar3 + 0xb80;
              *(undefined8 *)((long)emit_context + 0x18) = 0xb80;
              iVar4 = *(int *)(*(long *)((long)pvVar3 + 0xb80) + 0xb90) + -0xb80;
            }
            *(int *)((long)pvVar3 + 0xb90) = iVar4;
          }
          pvVar3 = (void *)(*(long *)((long)emit_context + 0x10) - uVar9);
          *(void **)((long)emit_context + 0x10) = pvVar3;
          *(ulong *)((long)emit_context + 0x18) = uVar6 - uVar9;
          pvVar7 = (void *)((long)pvVar7 - uVar9);
          memcpy(pvVar3,pvVar7,uVar9);
          uVar8 = uVar8 - uVar9;
        } while (uVar8 != 0);
      }
      iov_count = iov_count + -1;
    } while (iov_count != 0);
  }
  else {
    uVar8 = *(ulong *)((long)emit_context + 0x28);
    if (len <= uVar8) {
      puVar5 = (ulong *)((long)emit_context + 0x28);
      pvVar7 = *(void **)((long)emit_context + 0x20);
      *(size_t *)((long)emit_context + 0x20) = (long)pvVar7 + len;
LAB_001211b7:
      *puVar5 = uVar8 - len;
      if (iov_count != 0) {
        do {
          memcpy(pvVar7,iov->iov_base,iov->iov_len);
          pvVar7 = (void *)((long)pvVar7 + iov->iov_len);
          iov = iov + 1;
          iov_count = iov_count + -1;
        } while (iov_count != 0);
        return 0;
      }
      return 0;
    }
    if (iov_count == 0) {
      return 0;
    }
    do {
      uVar6 = iov->iov_len;
      if (uVar6 != 0) {
        pvVar7 = iov->iov_base;
        do {
          while ((uVar9 = uVar6, uVar8 < uVar6 && (uVar9 = uVar8, uVar8 == 0))) {
            lVar1 = *(long *)((long)emit_context + 8);
            if ((lVar1 == 0) || (pvVar3 = *(void **)(lVar1 + 0xb80), pvVar3 == *emit_context)) {
              pvVar3 = malloc(0xb98);
              if (pvVar3 == (void *)0x0) {
                return -1;
              }
              *(long *)((long)emit_context + 0x38) = *(long *)((long)emit_context + 0x38) + 0xb80;
              if (lVar1 != 0) {
                *(long *)((long)pvVar3 + 0xb88) = lVar1;
                lVar2 = *emit_context;
                *(long *)((long)pvVar3 + 0xb80) = lVar2;
                *(void **)(lVar2 + 0xb88) = pvVar3;
                *(void **)(lVar1 + 0xb80) = pvVar3;
                goto LAB_00120f6f;
              }
              *(void **)emit_context = pvVar3;
              *(void **)((long)emit_context + 8) = pvVar3;
              *(void **)((long)pvVar3 + 0xb80) = pvVar3;
              *(void **)((long)pvVar3 + 0xb88) = pvVar3;
              uVar8 = 0x5c0;
              *(long *)((long)emit_context + 0x10) = (long)pvVar3 + 0x5c0;
              *(long *)((long)emit_context + 0x20) = (long)pvVar3 + 0x5c0;
              *(undefined8 *)((long)emit_context + 0x18) = 0x5c0;
              *(undefined8 *)((long)emit_context + 0x28) = 0x5c0;
              iVar4 = -0x5c0;
            }
            else {
LAB_00120f6f:
              *(void **)((long)emit_context + 8) = pvVar3;
              *(void **)((long)emit_context + 0x20) = pvVar3;
              *(undefined8 *)((long)emit_context + 0x28) = 0xb80;
              iVar4 = *(int *)(*(long *)((long)pvVar3 + 0xb88) + 0xb90) + 0xb80;
              uVar8 = 0xb80;
            }
            *(int *)((long)pvVar3 + 0xb90) = iVar4;
          }
          memcpy(*(void **)((long)emit_context + 0x20),pvVar7,uVar9);
          pvVar7 = (void *)((long)pvVar7 + uVar9);
          *(long *)((long)emit_context + 0x20) = *(long *)((long)emit_context + 0x20) + uVar9;
          uVar8 = *(long *)((long)emit_context + 0x28) - uVar9;
          *(ulong *)((long)emit_context + 0x28) = uVar8;
          uVar6 = uVar6 - uVar9;
        } while (uVar6 != 0);
      }
      iov_count = iov_count + -1;
      iov = iov + 1;
    } while (iov_count != 0);
  }
  return 0;
}

Assistant:

int flatcc_emitter(void *emit_context,
        const flatcc_iovec_t *iov, int iov_count,
        flatbuffers_soffset_t offset, size_t len)
{
    flatcc_emitter_t *E = emit_context;
    uint8_t *p;

    E->used += len;
    if (offset < 0) {
        if (len <= E->front_left) {
            E->front_cursor -= len;
            E->front_left -= len;
            p = E->front_cursor;
            goto copy;
        }
        iov += iov_count;
        while (iov_count--) {
            --iov;
            if (copy_front(E, iov->iov_base, iov->iov_len)) {
                return -1;
            }
        }
    } else {
        if (len <= E->back_left) {
            p = E->back_cursor;
            E->back_cursor += len;
            E->back_left -= len;
            goto copy;
        }
        while (iov_count--) {
            if (copy_back(E, iov->iov_base, iov->iov_len)) {
                return -1;
            }
            ++iov;
        }
    }
    return 0;
copy:
    while (iov_count--) {
        memcpy(p, iov->iov_base, iov->iov_len);
        p += iov->iov_len;
        ++iov;
    }
    return 0;
}